

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

string * __thiscall
toml::detail::location<std::vector<char,std::allocator<char>>>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)((long)this + 0x20),
             *(long *)((long)this + 0x28) + *(long *)((long)this + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {return source_name_;}